

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OptimizeAddedConstants.cpp
# Opt level: O0

bool __thiscall
wasm::MemoryAccessOptimizer<wasm::OptimizeAddedConstants,_wasm::Load>::optimize
          (MemoryAccessOptimizer<wasm::OptimizeAddedConstants,_wasm::Load> *this)

{
  bool bVar1;
  size_t sVar2;
  value_type *ppLVar3;
  Binary *pBVar4;
  Binary *add_1;
  Expression *value;
  LocalSet *local_38;
  LocalSet *set;
  mapped_type *sets;
  LocalGet *get;
  Binary *add;
  MemoryAccessOptimizer<wasm::OptimizeAddedConstants,_wasm::Load> *this_local;
  
  add = (Binary *)this;
  bVar1 = Expression::is<wasm::Const>(this->curr->ptr);
  if (bVar1) {
    optimizeConstantPointer(this);
  }
  else {
    get = (LocalGet *)Expression::dynCast<wasm::Binary>(this->curr->ptr);
    if (((((Binary *)get == (Binary *)0x0) ||
         ((((Binary *)get)->op != AddInt32 && (((Binary *)get)->op != AddInt64)))) ||
        ((bVar1 = tryToOptimizeConstant(this,((Binary *)get)->right,((Binary *)get)->left), !bVar1
         && (bVar1 = tryToOptimizeConstant
                               (this,*(Expression **)
                                      &get[1].super_SpecificExpression<(wasm::Expression::Id)8>.
                                       super_Expression,
                                (Expression *)
                                get[1].super_SpecificExpression<(wasm::Expression::Id)8>.
                                super_Expression.type.id), !bVar1)))) &&
       ((this->localGraph != (LocalGraph *)0x0 &&
        (sets = (mapped_type *)Expression::dynCast<wasm::LocalGet>(this->curr->ptr),
        (LocalGet *)sets != (LocalGet *)0x0)))) {
      set = (LocalSet *)
            std::
            unordered_map<wasm::LocalGet_*,_wasm::SmallSet<wasm::LocalSet_*,_2UL>,_std::hash<wasm::LocalGet_*>,_std::equal_to<wasm::LocalGet_*>,_std::allocator<std::pair<wasm::LocalGet_*const,_wasm::SmallSet<wasm::LocalSet_*,_2UL>_>_>_>
            ::operator[](&this->localGraph->getSetses,(key_type *)&sets);
      sVar2 = SmallSetBase<wasm::LocalSet_*,_2UL,_wasm::OrderedFixedStorage<wasm::LocalSet_*,_2UL>,_std::set<wasm::LocalSet_*,_std::less<wasm::LocalSet_*>,_std::allocator<wasm::LocalSet_*>_>_>
              ::size((SmallSetBase<wasm::LocalSet_*,_2UL,_wasm::OrderedFixedStorage<wasm::LocalSet_*,_2UL>,_std::set<wasm::LocalSet_*,_std::less<wasm::LocalSet_*>,_std::allocator<wasm::LocalSet_*>_>_>
                      *)set);
      if (sVar2 == 1) {
        SmallSetBase<wasm::LocalSet_*,_2UL,_wasm::OrderedFixedStorage<wasm::LocalSet_*,_2UL>,_std::set<wasm::LocalSet_*,_std::less<wasm::LocalSet_*>,_std::allocator<wasm::LocalSet_*>_>_>
        ::begin((Iterator *)&value,
                (SmallSetBase<wasm::LocalSet_*,_2UL,_wasm::OrderedFixedStorage<wasm::LocalSet_*,_2UL>,_std::set<wasm::LocalSet_*,_std::less<wasm::LocalSet_*>,_std::allocator<wasm::LocalSet_*>_>_>
                 *)set);
        ppLVar3 = SmallSetBase<wasm::LocalSet_*,_2UL,_wasm::OrderedFixedStorage<wasm::LocalSet_*,_2UL>,_std::set<wasm::LocalSet_*,_std::less<wasm::LocalSet_*>,_std::allocator<wasm::LocalSet_*>_>_>
                  ::
                  IteratorBase<wasm::SmallSetBase<wasm::LocalSet_*,_2UL,_wasm::OrderedFixedStorage<wasm::LocalSet_*,_2UL>,_std::set<wasm::LocalSet_*,_std::less<wasm::LocalSet_*>,_std::allocator<wasm::LocalSet_*>_>_>,_std::_Rb_tree_const_iterator<wasm::LocalSet_*>_>
                  ::operator*((IteratorBase<wasm::SmallSetBase<wasm::LocalSet_*,_2UL,_wasm::OrderedFixedStorage<wasm::LocalSet_*,_2UL>,_std::set<wasm::LocalSet_*,_std::less<wasm::LocalSet_*>,_std::allocator<wasm::LocalSet_*>_>_>,_std::_Rb_tree_const_iterator<wasm::LocalSet_*>_>
                               *)&value);
        local_38 = *ppLVar3;
        if ((((local_38 != (LocalSet *)0x0) &&
             (bVar1 = OptimizeAddedConstants::isPropagatable(this->parent,local_38), bVar1)) &&
            (pBVar4 = Expression::dynCast<wasm::Binary>(local_38->value), pBVar4 != (Binary *)0x0))
           && ((pBVar4->op == AddInt32 &&
               ((bVar1 = tryToOptimizePropagatedAdd
                                   (this,pBVar4->right,pBVar4->left,(LocalGet *)sets,local_38),
                bVar1 || (bVar1 = tryToOptimizePropagatedAdd
                                            (this,pBVar4->left,pBVar4->right,(LocalGet *)sets,
                                             local_38), bVar1)))))) {
          return true;
        }
      }
    }
  }
  return false;
}

Assistant:

bool optimize() {
    // The pointer itself may be a constant, if e.g. it was precomputed or
    // a get that we propagated.
    if (curr->ptr->template is<Const>()) {
      optimizeConstantPointer();
      return false;
    }
    if (auto* add = curr->ptr->template dynCast<Binary>()) {
      if (add->op == AddInt32 || add->op == AddInt64) {
        // Look for a constant on both sides.
        if (tryToOptimizeConstant(add->right, add->left) ||
            tryToOptimizeConstant(add->left, add->right)) {
          return false;
        }
      }
    }
    if (localGraph) {
      // A final important case is a propagated add:
      //
      //  x = y + 10
      //  ..
      //  load(x)
      // =>
      //  x = y + 10
      //  ..
      //  load(y, offset=10)
      //
      // This is only valid if y does not change in the middle!
      if (auto* get = curr->ptr->template dynCast<LocalGet>()) {
        auto& sets = localGraph->getSetses[get];
        if (sets.size() == 1) {
          auto* set = *sets.begin();
          // May be a zero-init (in which case, we can ignore it). Must also be
          // valid to propagate, as checked earlier in the parent.
          if (set && parent->isPropagatable(set)) {
            auto* value = set->value;
            if (auto* add = value->template dynCast<Binary>()) {
              if (add->op == AddInt32) {
                // We can optimize on either side, but only if both we find
                // a constant *and* the other side cannot change in the middle.
                // TODO If it could change, we may add a new local to capture
                //      the old value.
                if (tryToOptimizePropagatedAdd(
                      add->right, add->left, get, set) ||
                    tryToOptimizePropagatedAdd(
                      add->left, add->right, get, set)) {
                  return true;
                }
              }
            }
          }
        }
      }
    }
    return false;
  }